

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::messageLoop(RpcConnectionState *this)

{
  bool bVar1;
  Own<kj::PromiseFulfiller<void>_> *t;
  Own<capnp::_::VatNetworkBase::Connection> *this_00;
  Connection *pCVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar3;
  long in_RSI;
  Promise<void> PVar4;
  PropagateException local_a8 [16];
  PropagateException local_98 [8];
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> local_90;
  Promise<bool> local_80;
  PropagateException local_68 [24];
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_50;
  undefined1 local_40 [8];
  PromiseFulfillerPair<void> paf;
  RpcConnectionState *this_local;
  
  bVar1 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
          is<kj::Own<capnp::_::VatNetworkBase::Connection>>
                    ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                     (in_RSI + 0x48));
  if (bVar1) {
    if (*(ulong *)(in_RSI + 0xa20) < *(ulong *)(in_RSI + 0xa28)) {
      kj::newPromiseAndFulfiller<void>();
      t = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>
                    ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_50,t);
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0xa30),&local_50);
      kj::Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_50);
      kj::Promise<void>::
      then<capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::_lambda()_1_,kj::_::PropagateException>
                ((Promise<void> *)this,(Type *)local_40,local_68);
      kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_40);
      pPVar3 = extraout_RDX_00;
    }
    else {
      this_00 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
                get<kj::Own<capnp::_::VatNetworkBase::Connection>>
                          ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                           (in_RSI + 0x48));
      pCVar2 = kj::Own<capnp::_::VatNetworkBase::Connection>::operator->(this_00);
      (*pCVar2->_vptr_Connection[1])();
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>::
      then<capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::_lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)_1_,kj::_::PropagateException>
                ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>> *)&local_80,
                 (Type *)&local_90,local_98);
      kj::Promise<bool>::
      then<capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::_lambda(bool)_1_,kj::_::PropagateException>
                ((Promise<bool> *)this,(Type *)&local_80,local_a8);
      kj::Promise<bool>::~Promise(&local_80);
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::~Promise(&local_90);
      pPVar3 = extraout_RDX_01;
    }
  }
  else {
    kj::Promise<void>::Promise((Promise<void> *)this);
    pPVar3 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> messageLoop() {
    if (!connection.is<Connected>()) {
      return kj::READY_NOW;
    }

    if (callWordsInFlight > flowLimit) {
      auto paf = kj::newPromiseAndFulfiller<void>();
      flowWaiter = kj::mv(paf.fulfiller);
      return paf.promise.then([this]() {
        return messageLoop();
      });
    }

    return connection.get<Connected>()->receiveIncomingMessage().then(
        [this](kj::Maybe<kj::Own<IncomingRpcMessage>>&& message) {
      KJ_IF_MAYBE(m, message) {
        handleMessage(kj::mv(*m));
        return true;
      } else {
        disconnect(KJ_EXCEPTION(DISCONNECTED, "Peer disconnected."));
        return false;
      }
    }).then([this](bool keepGoing) {
      // No exceptions; continue loop.
      //
      // (We do this in a separate continuation to handle the case where exceptions are
      // disabled.)
      if (keepGoing) tasks.add(messageLoop());
    });
  }